

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_local_name(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  ly_ctx *plVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  lysc_type *local_70;
  lysc_type *local_60;
  lyxp_set_meta *local_38;
  lyxp_set_node *item;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t arg_count_local;
  lyxp_set **args_local;
  
  if ((options & 0x1c) != 0) {
    set_scnode_clear_ctx(set,0);
    return LY_SUCCESS;
  }
  if (arg_count == 0) {
    if (set->type != LYXP_SET_NODE_SET) {
      plVar1 = set->ctx;
      pcVar3 = print_set_type(set);
      ly_vlog(plVar1,(char *)0x0,LYVE_XPATH,"Invalid context type %s in %s.",pcVar3,
              "local-name(node-set?)");
      return LY_EVALID;
    }
    if (set->used == 0) {
      set_fill_string(set,"",0);
      return LY_SUCCESS;
    }
    iVar2 = set_sort(set);
    if (iVar2 != 0) {
      __assert_fail("!set_sort(set)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                    ,0x11c8,
                    "LY_ERR xpath_local_name(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t)"
                   );
    }
    local_38 = (set->val).meta;
  }
  else {
    if ((*args)->type != LYXP_SET_NODE_SET) {
      plVar1 = set->ctx;
      pcVar3 = print_set_type(*args);
      ly_vlog(plVar1,(char *)0x0,LYVE_XPATH,
              "Wrong type of argument #%d (%s) for the XPath function %s.",1,pcVar3,
              "local-name(node-set?)");
      return LY_EVALID;
    }
    if ((*args)->used == 0) {
      set_fill_string(set,"",0);
      return LY_SUCCESS;
    }
    iVar2 = set_sort(*args);
    if (iVar2 != 0) {
      __assert_fail("!set_sort(args[0])",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                    ,0x11bb,
                    "LY_ERR xpath_local_name(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t)"
                   );
    }
    local_38 = ((*args)->val).meta;
  }
  switch(local_38->type) {
  case LYXP_NODE_NONE:
    ly_log(set->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",0x11cf);
    return LY_EINT;
  case LYXP_NODE_ROOT:
  case LYXP_NODE_ROOT_CONFIG:
  case LYXP_NODE_TEXT:
    set_fill_string(set,"",0);
    break;
  case LYXP_NODE_ELEM:
    if (local_38->meta->next == (lyd_meta *)0x0) {
      local_60 = *(lysc_type **)((long)&(local_38->meta->value).field_2 + 0x10);
    }
    else {
      local_60 = (local_38->meta->next->value).realtype;
    }
    if (local_38->meta->next == (lyd_meta *)0x0) {
      local_70 = *(lysc_type **)((long)&(local_38->meta->value).field_2 + 0x10);
    }
    else {
      local_70 = (local_38->meta->next->value).realtype;
    }
    sVar4 = strlen((char *)local_70);
    set_fill_string(set,(char *)local_60,(uint32_t)sVar4);
    break;
  case LYXP_NODE_META:
    pcVar3 = local_38->meta->name;
    sVar4 = strlen(local_38->meta->name);
    set_fill_string(set,pcVar3,(uint32_t)sVar4);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_local_name(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    struct lyxp_set_node *item;

    /* suppress unused variable warning */
    (void)options;

    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);
        return LY_SUCCESS;
    }

    if (arg_count) {
        if (args[0]->type != LYXP_SET_NODE_SET) {
            LOGVAL(set->ctx, LY_VCODE_XP_INARGTYPE, 1, print_set_type(args[0]),
                    "local-name(node-set?)");
            return LY_EVALID;
        } else if (!args[0]->used) {
            set_fill_string(set, "", 0);
            return LY_SUCCESS;
        }

        /* we need the set sorted, it affects the result */
        assert(!set_sort(args[0]));

        item = &args[0]->val.nodes[0];
    } else {
        if (set->type != LYXP_SET_NODE_SET) {
            LOGVAL(set->ctx, LY_VCODE_XP_INCTX, print_set_type(set), "local-name(node-set?)");
            return LY_EVALID;
        } else if (!set->used) {
            set_fill_string(set, "", 0);
            return LY_SUCCESS;
        }

        /* we need the set sorted, it affects the result */
        assert(!set_sort(set));

        item = &set->val.nodes[0];
    }

    switch (item->type) {
    case LYXP_NODE_NONE:
        LOGINT_RET(set->ctx);
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
    case LYXP_NODE_TEXT:
        set_fill_string(set, "", 0);
        break;
    case LYXP_NODE_ELEM:
        set_fill_string(set, LYD_NAME(item->node), strlen(LYD_NAME(item->node)));
        break;
    case LYXP_NODE_META:
        set_fill_string(set, ((struct lyd_meta *)item->node)->name, strlen(((struct lyd_meta *)item->node)->name));
        break;
    }

    return LY_SUCCESS;
}